

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utext.cpp
# Opt level: O2

UChar32 utext_next32_63(UText *ut)

{
  UChar UVar1;
  UBool UVar2;
  int iVar3;
  UChar *pUVar4;
  int iVar5;
  uint uVar6;
  
  iVar5 = ut->chunkOffset;
  if (ut->chunkLength <= iVar5) {
    UVar2 = (*ut->pFuncs->access)(ut,ut->chunkNativeLimit,'\x01');
    if (UVar2 == '\0') {
      return -1;
    }
    iVar5 = ut->chunkOffset;
  }
  pUVar4 = ut->chunkContents;
  iVar3 = iVar5 + 1;
  ut->chunkOffset = iVar3;
  UVar1 = pUVar4[iVar5];
  uVar6 = (uint)(ushort)UVar1;
  if ((UVar1 & 0xfc00U) == 0xd800) {
    if (ut->chunkLength <= iVar3) {
      UVar2 = (*ut->pFuncs->access)(ut,ut->chunkNativeLimit,'\x01');
      if (UVar2 == '\0') {
        return (uint)(ushort)UVar1;
      }
      pUVar4 = ut->chunkContents;
      iVar3 = ut->chunkOffset;
    }
    uVar6 = (uint)(ushort)UVar1;
    if (((ushort)pUVar4[iVar3] & 0xfc00) == 0xdc00) {
      uVar6 = (uint)(ushort)UVar1 * 0x400 + (uint)(ushort)pUVar4[iVar3] + 0xfca02400;
      ut->chunkOffset = iVar3 + 1;
    }
  }
  return uVar6;
}

Assistant:

U_CAPI UChar32 U_EXPORT2
utext_next32(UText *ut) {
    UChar32       c;

    if (ut->chunkOffset >= ut->chunkLength) {
        if (ut->pFuncs->access(ut, ut->chunkNativeLimit, TRUE) == FALSE) {
            return U_SENTINEL;
        }
    }

    c = ut->chunkContents[ut->chunkOffset++];
    if (U16_IS_LEAD(c) == FALSE) {
        // Normal case, not supplementary.
        //   (A trail surrogate seen here is just returned as is, as a surrogate value.
        //    It cannot be part of a pair.)
        return c;
    }

    if (ut->chunkOffset >= ut->chunkLength) {
        if (ut->pFuncs->access(ut, ut->chunkNativeLimit, TRUE) == FALSE) {
            // c is an unpaired lead surrogate at the end of the text.
            // return it as it is.
            return c;
        }
    }
    UChar32 trail = ut->chunkContents[ut->chunkOffset];
    if (U16_IS_TRAIL(trail) == FALSE) {
        // c was an unpaired lead surrogate, not at the end of the text.
        // return it as it is (unpaired).  Iteration position is on the
        // following character, possibly in the next chunk, where the
        //  trail surrogate would have been if it had existed.
        return c;
    }

    UChar32 supplementary = U16_GET_SUPPLEMENTARY(c, trail);
    ut->chunkOffset++;   // move iteration position over the trail surrogate.
    return supplementary;
    }